

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_dr_wav__read_chunk_header
                    (ma_dr_wav_read_proc onRead,void *pUserData,ma_dr_wav_container container,
                    ma_uint64 *pRunningBytesReadOut,ma_dr_wav_chunk_header *pHeaderOut)

{
  size_t sVar1;
  ma_uint8 sizeInBytes [4];
  ma_uint8 sizeInBytes_1 [8];
  
  if (ma_dr_wav_container_aiff < container) {
    return MA_INVALID_FILE;
  }
  if (container == ma_dr_wav_container_w64) {
    sVar1 = (*onRead)(pUserData,pHeaderOut,0x10);
    if (sVar1 != 0x10) {
      return MA_AT_END;
    }
    sVar1 = (*onRead)(pUserData,sizeInBytes_1,8);
    if (sVar1 == 8) {
      pHeaderOut->sizeInBytes = (long)sizeInBytes_1 - 0x18;
      pHeaderOut->paddingSize = sizeInBytes_1._0_4_ & 7;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 0x18;
      return MA_SUCCESS;
    }
  }
  else {
    sVar1 = (*onRead)(pUserData,pHeaderOut,4);
    if (sVar1 != 4) {
      return MA_AT_END;
    }
    sVar1 = (*onRead)(pUserData,sizeInBytes,4);
    if (sVar1 == 4) {
      if ((container == ma_dr_wav_container_aiff) || (container == ma_dr_wav_container_rifx)) {
        sizeInBytes = (ma_uint8  [4])
                      ((uint)sizeInBytes >> 0x18 | ((uint)sizeInBytes & 0xff0000) >> 8 |
                       ((uint)sizeInBytes & 0xff00) << 8 | (int)sizeInBytes << 0x18);
      }
      pHeaderOut->sizeInBytes = (ulong)(uint)sizeInBytes;
      pHeaderOut->paddingSize = (uint)sizeInBytes & 1;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 8;
      return MA_SUCCESS;
    }
  }
  return MA_INVALID_FILE;
}

Assistant:

MA_PRIVATE ma_result ma_dr_wav__read_chunk_header(ma_dr_wav_read_proc onRead, void* pUserData, ma_dr_wav_container container, ma_uint64* pRunningBytesReadOut, ma_dr_wav_chunk_header* pHeaderOut)
{
    if (container == ma_dr_wav_container_riff || container == ma_dr_wav_container_rifx || container == ma_dr_wav_container_rf64 || container == ma_dr_wav_container_aiff) {
        ma_uint8 sizeInBytes[4];
        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return MA_AT_END;
        }
        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return MA_INVALID_FILE;
        }
        pHeaderOut->sizeInBytes = ma_dr_wav_bytes_to_u32_ex(sizeInBytes, container);
        pHeaderOut->paddingSize = ma_dr_wav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 8;
    } else if (container == ma_dr_wav_container_w64) {
        ma_uint8 sizeInBytes[8];
        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return MA_AT_END;
        }
        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return MA_INVALID_FILE;
        }
        pHeaderOut->sizeInBytes = ma_dr_wav_bytes_to_u64(sizeInBytes) - 24;
        pHeaderOut->paddingSize = ma_dr_wav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    } else {
        return MA_INVALID_FILE;
    }
    return MA_SUCCESS;
}